

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O3

SFFile * ReadSF2(char *filename,FileReader *f)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SFFile *this;
  undefined8 uVar5;
  DWORD DVar6;
  DWORD chunklen;
  DWORD id;
  DWORD local_38;
  int local_34;
  FString local_30;
  
  iVar3 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[2])(f,&local_34,4);
  if (CONCAT44(extraout_var,iVar3) == 4) {
    if (local_34 == 0x46464952) {
      iVar4 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[2])(f,&local_34,4);
      iVar3 = local_34;
      if ((CONCAT44(extraout_var_00,iVar4) != 4) ||
         (iVar4 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[2])(f,&local_34,4),
         CONCAT44(extraout_var_01,iVar4) != 4)) goto LAB_00329499;
      if (local_34 == 0x6b626673) {
        check_list(f,0x4f464e49,iVar3 - 4,&local_38);
        this = (SFFile *)operator_new(0x90);
        FString::FString(&local_30,filename);
        SFFile::SFFile(this,&local_30);
        FString::~FString(&local_30);
        DVar6 = local_38;
        this->MinorVersion = -1;
        ParseLIST(this,f,local_38,INFOHandlers);
        if (-1 < this->MinorVersion) {
          DVar6 = (iVar3 - DVar6) - 0xc;
          check_list(f,0x61746473,DVar6,&local_38);
          ParseLIST(this,f,local_38,SdtaHandlers);
          if (this->SampleDataOffset != 0) {
            uVar1 = this->SizeSampleData;
            if ((this->SizeSampleDataLSB != uVar1) &&
               (this->SizeSampleDataLSB != (uVar1 & 1) + uVar1)) {
              this->SampleDataLSBOffset = 0;
              this->SizeSampleDataLSB = 0;
            }
            check_list(f,0x61746470,DVar6,&local_38);
            ParseLIST(this,f,local_38,PdtaHandlers);
            bVar2 = SFFile::FinalStructureTest(this);
            if (bVar2) {
              SFFile::CheckBags(this);
              SFFile::TranslatePercussions(this);
              return this;
            }
          }
        }
        uVar5 = __cxa_allocate_exception(1);
        __cxa_throw(uVar5,&CBadForm::typeinfo,0);
      }
    }
    return (SFFile *)0x0;
  }
LAB_00329499:
  uVar5 = __cxa_allocate_exception(1);
  __cxa_throw(uVar5,&CIOErr::typeinfo,0);
}

Assistant:

SFFile *ReadSF2(const char *filename, FileReader *f)
{
	SFFile *sf2 = NULL;
	DWORD filelen;
	DWORD chunklen;

	try
	{
		// Read RIFF sfbk header
		if (read_id(f) != ID_RIFF)
		{
			return NULL;
		}
		filelen = read_dword(f);
		if (read_id(f) != ID_sfbk)
		{
			return NULL;
		}
		filelen -= 4;

		// First chunk must be an INFO LIST
		check_list(f, ID_INFO, filelen, chunklen);

		sf2 = new SFFile(filename);

		ParseINFO(sf2, f, chunklen);
		filelen -= chunklen + 8;

		// Second chunk must be a sdta LIST
		check_list(f, ID_sdta, filelen, chunklen);
		ParseSdta(sf2, f, chunklen);

		// Third chunk must be a pdta LIST
		check_list(f, ID_pdta, filelen, chunklen);
		ParsePdta(sf2, f, chunklen);

		// There should be no more chunks. If there are, we'll just ignore them rather than reject the file.
		if (!sf2->FinalStructureTest())
		{
			throw CBadForm();
		}

		sf2->CheckBags();
		sf2->TranslatePercussions();

		return sf2;
	}
	catch (CIOErr)
	{
		Printf("Error reading %s: %s\n", filename, strerror(errno));
	}
	catch (CBadForm)
	{
		Printf("%s is corrupted.\n", filename);
	}
	catch (CBadVer)
	{
		Printf("%s is not a SoundFont version 2 file.\n", filename);
	}
	if (sf2 != NULL)
	{
		delete sf2;
	}
	return NULL;
}